

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O2

bool __thiscall Diligent::VAOCache::VAOHashKey::operator==(VAOHashKey *this,VAOHashKey *Key)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  Uint32 UVar4;
  uint uVar5;
  char (*in_RCX) [65];
  bool bVar6;
  string msg;
  string local_50;
  
  if ((((this->Hash == Key->Hash) && (this->PsoUId == Key->PsoUId)) &&
      (this->IndexBufferUId == Key->IndexBufferUId)) &&
     (UVar4 = this->UsedSlotsMask, UVar4 == Key->UsedSlotsMask)) {
    do {
      bVar6 = UVar4 == 0;
      if (bVar6) {
        return bVar6;
      }
      iVar2 = 0;
      if (UVar4 != 0) {
        for (; (UVar4 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
        }
      }
      puVar1 = (uint *)((long)&this->Streams[0].BufferUId + (ulong)(uint)(iVar2 << 4));
      uVar3 = *(uint *)((long)&this->Streams[0].BufferUId + (ulong)(uint)(iVar2 << 4));
      if ((int)uVar3 < 0) {
LAB_001b19cd:
        FormatString<char[26],char[65]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Streams[Slot].BufferUId >= 0 && Key.Streams[Slot].BufferUId >= 0"
                   ,in_RCX);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"operator==",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xea);
        std::__cxx11::string::~string((string *)&local_50);
        uVar3 = *puVar1;
        uVar5 = *(uint *)((long)&Key->Streams[0].BufferUId + (ulong)(uint)(iVar2 << 4));
      }
      else {
        uVar5 = *(uint *)((long)&Key->Streams[0].BufferUId + (ulong)(uint)(iVar2 << 4));
        in_RCX = (char (*) [65])(ulong)uVar5;
        if ((int)uVar5 < 0) goto LAB_001b19cd;
      }
      if (uVar3 != uVar5) {
        return bVar6;
      }
      UVar4 = UVar4 - 1 & UVar4;
      in_RCX = *(char (**) [65])((long)&Key->Streams[0].Offset + (ulong)(uint)(iVar2 << 4));
    } while (*(char (**) [65])(puVar1 + 2) == in_RCX);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool VAOCache::VAOHashKey::operator==(const VAOHashKey& Key) const noexcept
{
    if (Hash != Key.Hash)
        return false;

    // clang-format off
    if (PsoUId         != Key.PsoUId         ||
        IndexBufferUId != Key.IndexBufferUId ||
        UsedSlotsMask  != Key.UsedSlotsMask)
        return false;
    // clang-format on

    for (auto SlotMask = Key.UsedSlotsMask; SlotMask != 0;)
    {
        const auto SlotBit = ExtractLSB(SlotMask);
        const auto Slot    = PlatformMisc::GetLSB(SlotBit);
        VERIFY_EXPR(Streams[Slot].BufferUId >= 0 && Key.Streams[Slot].BufferUId >= 0);
        if (Streams[Slot] != Key.Streams[Slot])
            return false;
    }

    return true;
}